

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  undefined8 uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  BYTE *s;
  byte *pbVar8;
  byte *pbVar9;
  LZ4_byte *pLVar10;
  uint uVar11;
  LZ4_byte *pLVar12;
  ulong uVar13;
  byte *pbVar14;
  byte *__src;
  BYTE *d_1;
  byte *pbVar15;
  byte *pbVar16;
  BYTE *d;
  byte *pbVar17;
  ushort *puVar18;
  ushort *puVar19;
  uint uVar20;
  size_t sVar21;
  ulong uVar22;
  long local_50;
  int local_48;
  
  uVar13 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar13 == 0) {
    iVar7 = LZ4_decompress_fast(source,dest,originalSize);
joined_r0x00110e2c:
    if (0 < iVar7) {
      LZ4_streamDecode->table[3] = (long)originalSize;
      (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
    }
    return iVar7;
  }
  local_50 = (long)originalSize;
  pLVar10 = (LZ4_streamDecode->internal_donotuse).prefixEnd;
  if (pLVar10 != (LZ4_byte *)dest) {
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar13;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar10 + -uVar13;
    iVar7 = LZ4_decompress_fast_extDict(source,dest,originalSize,pLVar10 + -uVar13,uVar13);
    goto joined_r0x00110e2c;
  }
  if ((uVar13 < 0xffff) && (LZ4_streamDecode->table[1] != 0)) {
    if (source == (char *)0x0) {
      return -1;
    }
    pLVar12 = (LZ4_streamDecode->internal_donotuse).externalDict + LZ4_streamDecode->table[1];
    if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
      pLVar12 = (LZ4_byte *)0x0;
    }
    if (originalSize == 0) {
      if (*source != '\0') {
        return -1;
      }
      local_48 = 1;
      local_50 = 0;
      goto LAB_00110ee2;
    }
    __src = (byte *)(dest + -uVar13);
    pbVar1 = (byte *)(dest + local_50);
    local_48 = (int)source;
    pbVar17 = (byte *)dest;
    if (0x3f < originalSize) {
LAB_00110f1c:
      do {
        bVar3 = (byte)*(ushort *)source;
        uVar11 = (uint)bVar3;
        uVar20 = (uint)(bVar3 >> 4);
        if (uVar20 == 0xf) {
          uVar20 = 0;
          puVar19 = (ushort *)((long)source + 0x10);
          do {
            puVar18 = puVar19;
            uVar20 = uVar20 + *(byte *)((long)puVar18 + -0xf);
            puVar19 = (ushort *)((long)puVar18 + 1);
          } while (*(byte *)((long)puVar18 + -0xf) == 0xff);
          uVar13 = (ulong)uVar20;
          pbVar15 = pbVar17 + uVar13 + 0xf;
          if (dest + local_50 + -8 < pbVar15) {
            sVar21 = uVar13 + 0xf;
            source = (char *)(puVar18 + -7);
            goto LAB_0011127a;
          }
          puVar19 = puVar18 + -7;
          do {
            *(undefined8 *)pbVar17 = *(undefined8 *)puVar19;
            pbVar17 = pbVar17 + 8;
            puVar19 = puVar19 + 4;
          } while (pbVar17 < pbVar15);
          puVar19 = (ushort *)((long)puVar18 + 1 + uVar13);
        }
        else {
          *(undefined8 *)pbVar17 = *(undefined8 *)((long)source + 1);
          if (0x8f < bVar3) {
            *(undefined8 *)(pbVar17 + 8) = *(undefined8 *)((long)source + 9);
          }
          pbVar15 = pbVar17 + uVar20;
          puVar19 = (ushort *)((byte *)((long)source + 1) + uVar20);
        }
        uVar6 = *puVar19;
        uVar13 = (ulong)uVar6;
        uVar20 = (uint)uVar6;
        source = (char *)(puVar19 + 1);
        pbVar8 = pbVar15 + -uVar13;
        uVar22 = (ulong)(bVar3 & 0xf);
        if (uVar22 == 0xf) {
          uVar11 = 0;
          do {
            uVar5 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar11 = uVar11 + (byte)uVar5;
          } while ((byte)uVar5 == 0xff);
          sVar21 = (ulong)uVar11 + 0x13;
          if (pbVar1 + -0x40 <= pbVar15 + (ulong)uVar11 + 0x13) goto LAB_001112d3;
        }
        else {
          sVar21 = uVar22 + 4;
          if (pbVar1 + -0x40 <= pbVar15 + uVar22 + 4) goto LAB_001112d3;
          if ((__src <= pbVar8) && (7 < uVar6)) {
            *(undefined8 *)pbVar15 = *(undefined8 *)pbVar8;
            *(undefined8 *)(pbVar15 + 8) = *(undefined8 *)(pbVar8 + 8);
            *(undefined2 *)(pbVar15 + 0x10) = *(undefined2 *)(pbVar8 + 0x10);
            pbVar17 = pbVar15 + uVar22 + 4;
            goto LAB_00110f1c;
          }
        }
        pbVar2 = pbVar15 + sVar21;
        pbVar17 = pbVar2;
        if (pbVar8 < __src) {
          if (pbVar2 <= pbVar1 + -5) {
            uVar13 = (long)__src - (long)pbVar8;
            uVar22 = sVar21 - uVar13;
            if (sVar21 < uVar13 || uVar22 == 0) {
              memmove(pbVar15,pLVar12 + -uVar13,sVar21);
            }
            else {
              memcpy(pbVar15,pLVar12 + -uVar13,uVar13);
              pbVar17 = pbVar15 + uVar13;
              pbVar15 = __src;
              if ((ulong)((long)pbVar17 - (long)__src) < uVar22) {
                for (; pbVar17 < pbVar2; pbVar17 = pbVar17 + 1) {
                  *pbVar17 = *pbVar15;
                  pbVar15 = pbVar15 + 1;
                }
              }
              else {
                memcpy(pbVar17,__src,uVar22);
                pbVar17 = pbVar2;
              }
            }
            goto LAB_00110f1c;
          }
          goto LAB_001113d6;
        }
        if (uVar6 < 0x10) {
          if (uVar13 == 4) {
            iVar7 = *(int *)pbVar8;
          }
          else if (uVar6 == 2) {
            iVar7 = CONCAT22(*(undefined2 *)pbVar8,*(undefined2 *)pbVar8);
          }
          else {
            if (uVar6 != 1) {
              if (uVar6 < 8) {
                pbVar15[0] = 0;
                pbVar15[1] = 0;
                pbVar15[2] = 0;
                pbVar15[3] = 0;
                *pbVar15 = *pbVar8;
                pbVar15[1] = pbVar8[1];
                pbVar15[2] = pbVar8[2];
                pbVar15[3] = pbVar8[3];
                uVar20 = inc32table[uVar6];
                *(undefined4 *)(pbVar15 + 4) = *(undefined4 *)(pbVar8 + uVar20);
                pbVar8 = pbVar8 + ((ulong)uVar20 - (long)dec64table[uVar6]);
              }
              else {
                *(undefined8 *)pbVar15 = *(undefined8 *)pbVar8;
                pbVar8 = pbVar8 + 8;
              }
              pbVar15 = pbVar15 + 8;
              do {
                *(undefined8 *)pbVar15 = *(undefined8 *)pbVar8;
                pbVar15 = pbVar15 + 8;
                pbVar8 = pbVar8 + 8;
              } while (pbVar15 < pbVar2);
              goto LAB_00110f1c;
            }
            iVar7 = (uint)*pbVar8 * 0x1010101;
          }
          do {
            *(int *)pbVar15 = iVar7;
            *(int *)(pbVar15 + 4) = iVar7;
            pbVar15 = pbVar15 + 8;
          } while (pbVar15 < pbVar2);
          goto LAB_00110f1c;
        }
        do {
          uVar4 = *(undefined8 *)(pbVar15 + -uVar13 + 8);
          *(undefined8 *)pbVar15 = *(undefined8 *)(pbVar15 + -uVar13);
          *(undefined8 *)(pbVar15 + 8) = uVar4;
          uVar4 = *(undefined8 *)(pbVar15 + -uVar13 + 0x10 + 8);
          *(undefined8 *)(pbVar15 + 0x10) = *(undefined8 *)(pbVar15 + -uVar13 + 0x10);
          *(undefined8 *)(pbVar15 + 0x18) = uVar4;
          pbVar15 = pbVar15 + 0x20;
        } while (pbVar15 < pbVar2);
      } while( true );
    }
LAB_0011123b:
    uVar6 = *(ushort *)source;
    uVar11 = (uint)(byte)uVar6;
    source = (char *)((long)source + 1);
    uVar20 = (uint)(byte)((byte)uVar6 >> 4);
    sVar21 = (size_t)uVar20;
    if ((uVar11 < 0x90) && (pbVar17 <= dest + local_50 + -0x1a)) {
      *(undefined8 *)pbVar17 = *(undefined8 *)source;
      pbVar15 = pbVar17 + sVar21;
      uVar13 = (ulong)(uVar11 & 0xf);
      puVar19 = (ushort *)((long)source + sVar21);
      source = (char *)(puVar19 + 1);
      uVar6 = *puVar19;
      pbVar8 = pbVar15 + -(ulong)uVar6;
      if (((uVar13 != 0xf) && (7 < uVar6)) && (__src <= pbVar8)) {
        *(undefined8 *)pbVar15 = *(undefined8 *)pbVar8;
        *(undefined8 *)(pbVar15 + 8) = *(undefined8 *)(pbVar8 + 8);
        *(undefined2 *)(pbVar15 + 0x10) = *(undefined2 *)(pbVar8 + 0x10);
        pbVar17 = pbVar15 + uVar13 + 4;
        goto LAB_0011123b;
      }
LAB_001112b1:
      uVar20 = (uint)uVar6;
      if ((int)uVar13 == 0xf) {
        uVar11 = 0;
        do {
          uVar6 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar11 = uVar11 + (byte)uVar6;
        } while ((byte)uVar6 == 0xff);
        uVar13 = (ulong)uVar11 + 0xf;
      }
      sVar21 = uVar13 + 4;
LAB_001112d3:
      pbVar2 = pbVar15 + sVar21;
      pbVar17 = pbVar2;
      if (pbVar8 < __src) {
        if (pbVar1 + -5 < pbVar2) goto LAB_001113d6;
        uVar13 = (long)__src - (long)pbVar8;
        uVar22 = sVar21 - uVar13;
        if (sVar21 < uVar13 || uVar22 == 0) {
          memmove(pbVar15,pLVar12 + -uVar13,sVar21);
        }
        else {
          memcpy(pbVar15,pLVar12 + -uVar13,uVar13);
          pbVar17 = pbVar15 + uVar13;
          pbVar15 = __src;
          if ((ulong)((long)pbVar17 - (long)__src) < uVar22) {
            for (; pbVar17 < pbVar2; pbVar17 = pbVar17 + 1) {
              *pbVar17 = *pbVar15;
              pbVar15 = pbVar15 + 1;
            }
          }
          else {
            memcpy(pbVar17,__src,uVar22);
            pbVar17 = pbVar2;
          }
        }
      }
      else {
        if (uVar20 < 8) {
          pbVar15[0] = 0;
          pbVar15[1] = 0;
          pbVar15[2] = 0;
          pbVar15[3] = 0;
          *pbVar15 = *pbVar8;
          pbVar15[1] = pbVar8[1];
          pbVar15[2] = pbVar8[2];
          pbVar15[3] = pbVar8[3];
          uVar13 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar20 << 2));
          *(undefined4 *)(pbVar15 + 4) = *(undefined4 *)(pbVar8 + uVar13);
          pbVar8 = pbVar8 + (uVar13 - (long)*(int *)((long)dec64table + (ulong)(uVar20 << 2)));
        }
        else {
          *(undefined8 *)pbVar15 = *(undefined8 *)pbVar8;
          pbVar8 = pbVar8 + 8;
        }
        pbVar9 = pbVar15 + 8;
        if (pbVar1 + -0xc < pbVar2) {
          if (pbVar1 + -5 < pbVar2) goto LAB_001113d6;
          pbVar15 = pbVar1 + -7;
          pbVar14 = pbVar8;
          pbVar16 = pbVar9;
          if (pbVar9 < pbVar15) {
            do {
              *(undefined8 *)pbVar16 = *(undefined8 *)pbVar14;
              pbVar16 = pbVar16 + 8;
              pbVar14 = pbVar14 + 8;
            } while (pbVar16 < pbVar15);
            pbVar8 = pbVar8 + ((long)pbVar15 - (long)pbVar9);
            pbVar9 = pbVar15;
          }
          for (; pbVar9 < pbVar2; pbVar9 = pbVar9 + 1) {
            bVar3 = *pbVar8;
            pbVar8 = pbVar8 + 1;
            *pbVar9 = bVar3;
          }
        }
        else {
          *(undefined8 *)pbVar9 = *(undefined8 *)pbVar8;
          if (0x10 < sVar21) {
            pbVar15 = pbVar15 + 0x10;
            do {
              pbVar8 = pbVar8 + 8;
              *(undefined8 *)pbVar15 = *(undefined8 *)pbVar8;
              pbVar15 = pbVar15 + 8;
            } while (pbVar15 < pbVar2);
          }
        }
      }
      goto LAB_0011123b;
    }
    if (uVar20 == 0xf) {
      uVar20 = 0;
      do {
        uVar6 = *(ushort *)source;
        source = (char *)((long)source + 1);
        uVar20 = uVar20 + (byte)uVar6;
      } while ((byte)uVar6 == 0xff);
      sVar21 = (ulong)uVar20 + 0xf;
    }
    pbVar15 = pbVar17 + sVar21;
LAB_0011127a:
    puVar19 = (ushort *)source;
    if (pbVar15 <= dest + local_50 + -8) {
      do {
        *(undefined8 *)pbVar17 = *(undefined8 *)puVar19;
        pbVar17 = pbVar17 + 8;
        puVar19 = puVar19 + 4;
      } while (pbVar17 < pbVar15);
      puVar19 = (ushort *)((long)source + sVar21);
      source = (char *)(puVar19 + 1);
      uVar6 = *puVar19;
      pbVar8 = pbVar15 + -(ulong)uVar6;
      uVar13 = (ulong)(uVar11 & 0xf);
      goto LAB_001112b1;
    }
    if (pbVar15 == pbVar1) {
      memmove(pbVar17,source,sVar21);
      local_48 = ((int)source + (int)sVar21) - local_48;
      goto LAB_00110ed5;
    }
LAB_001113d6:
    local_48 = ~(uint)source + local_48;
  }
  else {
    local_48 = LZ4_decompress_fast(source,dest,originalSize);
  }
LAB_00110ed5:
  if (local_48 < 1) {
    return local_48;
  }
  pLVar10 = (LZ4_streamDecode->internal_donotuse).prefixEnd;
  uVar13 = LZ4_streamDecode->table[3];
LAB_00110ee2:
  LZ4_streamDecode->table[3] = uVar13 + local_50;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = pLVar10 + local_50;
  return local_48;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        if (lz4sd->prefixSize >= 64 KB - 1 || lz4sd->extDictSize == 0)
            result = LZ4_decompress_fast(source, dest, originalSize);
        else
            result = LZ4_decompress_fast_doubleDict(source, dest, originalSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}